

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_wire.cpp
# Opt level: O0

void __thiscall lsim::ModelWire::simplify(ModelWire *this)

{
  bool bVar1;
  pointer this_00;
  size_t sVar2;
  reference ppMVar3;
  ModelWireSegment *this_01;
  ModelWireSegment *this_02;
  Point *pPVar4;
  ModelWireJunction *pMVar5;
  ModelWireJunction *pMVar6;
  Point *local_c0;
  Point local_98;
  Point points [3];
  ModelWireSegment *segments [2];
  value_type junction_1;
  reference local_48;
  unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_> *junction;
  iterator __end1;
  iterator __begin1;
  junction_container_t *__range1;
  vector<lsim::ModelWireJunction_*,_std::allocator<lsim::ModelWireJunction_*>_> to_check;
  ModelWire *this_local;
  
  to_check.super__Vector_base<lsim::ModelWireJunction_*,_std::allocator<lsim::ModelWireJunction_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<lsim::ModelWireJunction_*,_std::allocator<lsim::ModelWireJunction_*>_>::vector
            ((vector<lsim::ModelWireJunction_*,_std::allocator<lsim::ModelWireJunction_*>_> *)
             &__range1);
  __end1 = std::
           vector<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>,_std::allocator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_>_>
           ::begin(&this->m_junctions);
  junction = (unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_> *)
             std::
             vector<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>,_std::allocator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_>_>
             ::end(&this->m_junctions);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_*,_std::vector<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>,_std::allocator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_>_>_>
                                     *)&junction), bVar1) {
    local_48 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_*,_std::vector<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>,_std::allocator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_>_>_>
               ::operator*(&__end1);
    this_00 = std::
              unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>::
              operator->(local_48);
    sVar2 = ModelWireJunction::num_segments(this_00);
    if (sVar2 == 2) {
      junction_1 = std::
                   unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>
                   ::get(local_48);
      std::vector<lsim::ModelWireJunction_*,_std::allocator<lsim::ModelWireJunction_*>_>::push_back
                ((vector<lsim::ModelWireJunction_*,_std::allocator<lsim::ModelWireJunction_*>_> *)
                 &__range1,&junction_1);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_*,_std::vector<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>,_std::allocator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_>_>_>
    ::operator++(&__end1);
  }
  while (bVar1 = std::vector<lsim::ModelWireJunction_*,_std::allocator<lsim::ModelWireJunction_*>_>
                 ::empty((vector<lsim::ModelWireJunction_*,_std::allocator<lsim::ModelWireJunction_*>_>
                          *)&__range1), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppMVar3 = std::vector<lsim::ModelWireJunction_*,_std::allocator<lsim::ModelWireJunction_*>_>::
              back((vector<lsim::ModelWireJunction_*,_std::allocator<lsim::ModelWireJunction_*>_> *)
                   &__range1);
    pMVar6 = *ppMVar3;
    std::vector<lsim::ModelWireJunction_*,_std::allocator<lsim::ModelWireJunction_*>_>::pop_back
              ((vector<lsim::ModelWireJunction_*,_std::allocator<lsim::ModelWireJunction_*>_> *)
               &__range1);
    this_01 = ModelWireJunction::segment(pMVar6,0);
    this_02 = ModelWireJunction::segment(pMVar6,1);
    pPVar4 = ModelWireJunction::position(pMVar6);
    local_98 = *pPVar4;
    local_c0 = points;
    do {
      memset(local_c0,0,8);
      Point::Point(local_c0);
      local_c0 = local_c0 + 1;
    } while (local_c0 != points + 2);
    pMVar5 = ModelWireSegment::junction(this_01,0);
    pMVar5 = ModelWireSegment::junction(this_01,(ulong)(pMVar5 == pMVar6));
    pPVar4 = ModelWireJunction::position(pMVar5);
    points[0] = *pPVar4;
    pMVar5 = ModelWireSegment::junction(this_02,0);
    pMVar6 = ModelWireSegment::junction(this_02,(ulong)(pMVar5 == pMVar6));
    pPVar4 = ModelWireJunction::position(pMVar6);
    points[1] = *pPVar4;
    bVar1 = points_colinear(&local_98,points,points + 1);
    if (bVar1) {
      add_segment(this,points,points + 1);
      remove_redundant_segment(this,this_01);
      remove_redundant_segment(this,this_02);
    }
  }
  std::vector<lsim::ModelWireJunction_*,_std::allocator<lsim::ModelWireJunction_*>_>::~vector
            ((vector<lsim::ModelWireJunction_*,_std::allocator<lsim::ModelWireJunction_*>_> *)
             &__range1);
  return;
}

Assistant:

void ModelWire::simplify() {
    // duplicate junctions shouldn't happen because of the way wires are merged. Check not implemented.

    // junctions with just two segments should be removed when the segments are colinear
    std::vector<ModelWireJunction *> to_check;

    for (auto &junction : m_junctions) {
        if (junction->num_segments() == 2) {
            to_check.push_back(junction.get());
        }
    }

    while (!to_check.empty()) {
        auto junction = to_check.back();
        to_check.pop_back();

        ModelWireSegment *segments[2] = {junction->segment(0), junction->segment(1)};

        Point points[3] = {junction->position()};
        points[1] = segments[0]->junction(segments[0]->junction(0) == junction ? 1 : 0)->position();
        points[2] = segments[1]->junction(segments[1]->junction(0) == junction ? 1 : 0)->position();

        if (points_colinear(points[0], points[1], points[2])) {
            add_segment(points[1], points[2]);
            remove_redundant_segment(segments[0]);
            remove_redundant_segment(segments[1]);
        }
    }
}